

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  Message *pMVar1;
  long lVar2;
  Symbol symbol;
  int iVar3;
  Descriptor *pDVar4;
  string *psVar5;
  string *psVar6;
  void *pvVar7;
  LogMessage *pLVar8;
  size_t sVar9;
  int iVar10;
  OptionsType *orig_options;
  long lVar11;
  int32 i;
  long lVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar16;
  DescriptorProto *arg9;
  string local_250;
  Descriptor *local_230;
  DescriptorBuilder *local_228;
  long local_220;
  LogMessage local_218;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar4 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar4 = (Descriptor *)this->file_;
  }
  psVar5 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar4 + 8));
  if (psVar5->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)psVar5,psVar5->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)psVar5,(ulong)(proto->name_->_M_dataplus)._M_p);
  ValidateSymbolName(this,proto->name_,psVar5,&proto->super_Message);
  psVar6 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar6;
  *(string **)(result + 8) = psVar5;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar10 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x2c) = iVar10;
  pvVar7 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar10 * 0x78);
  *(void **)(result + 0x30) = pvVar7;
  if (0 < (proto->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      BuildFieldOrExtension
                (this,(FieldDescriptorProto *)
                      (proto->field_).super_RepeatedPtrFieldBase.elements_[lVar14],result,
                 (FieldDescriptor *)(*(long *)(result + 0x30) + lVar12),false);
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar14 < (proto->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar10 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar10;
  pvVar7 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar10 * 0x78);
  *(void **)(result + 0x40) = pvVar7;
  if (0 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      BuildMessage(this,(DescriptorProto *)
                        (proto->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar14],result,
                   (Descriptor *)(*(long *)(result + 0x40) + lVar12));
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar14 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar10 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x48) = iVar10;
  pvVar7 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar10 * 0x38);
  *(void **)(result + 0x50) = pvVar7;
  if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      BuildEnum(this,(EnumDescriptorProto *)
                     (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar14],result,
                (EnumDescriptor *)(*(long *)(result + 0x50) + lVar12));
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x38;
    } while (lVar14 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar10 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x58) = iVar10;
  pvVar7 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar10 << 3);
  *(void **)(result + 0x60) = pvVar7;
  if (0 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      BuildExtensionRange(this,*(ExtensionRange **)
                                ((long)(proto->extension_range_).super_RepeatedPtrFieldBase.
                                       elements_ + lVar12),result,
                          (ExtensionRange *)(*(long *)(result + 0x60) + lVar12));
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar14 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar10 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x68) = iVar10;
  aVar16.descriptor = (Descriptor *)0x1d38cc;
  pvVar7 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar10 * 0x78);
  *(void **)(result + 0x70) = pvVar7;
  if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      aVar16.descriptor = (Descriptor *)0x1d38fc;
      BuildFieldOrExtension
                (this,(FieldDescriptorProto *)
                      (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar14],result,
                 (FieldDescriptor *)(*(long *)(result + 0x70) + lVar12),true);
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar14 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((proto->_has_bits_[0] & 0x40) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = *(OptionsType **)(DescriptorProto::default_instance_ + 0x90);
    }
    aVar16.descriptor = (Descriptor *)0x1d394e;
    AllocateOptionsImpl<google::protobuf::Descriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  symbol.field_1.descriptor = aVar16.descriptor;
  symbol._0_8_ = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  iVar10 = *(int *)(result + 0x2c);
  iVar3 = *(int *)(result + 0x58);
  arg9 = proto;
  local_230 = result;
  local_228 = this;
  if (0 < iVar10) {
    lVar12 = 0;
    do {
      if (0 < iVar3) {
        plVar13 = (long *)(lVar12 * 0x78 + *(long *)(result + 0x30));
        lVar14 = 0;
        proto = arg9;
        do {
          lVar11 = *(long *)(result + 0x60);
          iVar10 = *(int *)(lVar11 + lVar14 * 8);
          if ((iVar10 <= (int)plVar13[5]) && ((int)plVar13[5] < *(int *)(lVar11 + 4 + lVar14 * 8)))
          {
            psVar5 = (string *)plVar13[1];
            if ((proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ <= lVar14) {
              internal::LogMessage::LogMessage
                        (&local_218,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar8 = internal::LogMessage::operator<<
                                 (&local_218,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar8);
              internal::LogMessage::~LogMessage(&local_218);
              iVar10 = *(int32 *)(lVar11 + lVar14 * 8);
            }
            pMVar1 = (Message *)
                     (proto->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar14];
            local_218._0_8_ = FastInt32ToBuffer(iVar10,(char *)((long)&local_218.filename_ + 4));
            sVar9 = strlen((char *)local_218._0_8_);
            local_218.filename_._0_4_ = (undefined4)sVar9;
            local_1e0.text_ =
                 FastInt32ToBuffer(*(int *)(lVar11 + 4 + lVar14 * 8) + -1,local_1e0.scratch_);
            sVar9 = strlen(local_1e0.text_);
            local_1e0.size_ = (int)sVar9;
            local_180.text_ = *(char **)*plVar13;
            local_180.size_ = *(int *)((undefined8 *)*plVar13 + 1);
            local_1b0.text_ = FastInt32ToBuffer((int32)plVar13[5],local_1b0.scratch_);
            sVar9 = strlen(local_1b0.text_);
            local_1b0.size_ = (int)sVar9;
            local_60.text_ = (char *)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            local_f0.text_ = (char *)0x0;
            local_f0.size_ = -1;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_250,(strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                       (char *)&local_218,&local_1e0,&local_180,&local_1b0,&local_60,&local_90,
                       &local_c0,&local_f0,&local_120,&local_150,(SubstituteArg *)proto);
            AddError(local_228,psVar5,pMVar1,NUMBER,&local_250);
            result = local_230;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            iVar3 = *(int *)(result + 0x58);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar3);
        iVar10 = *(int *)(result + 0x2c);
        arg9 = proto;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar10);
  }
  if (0 < iVar3) {
    lVar14 = 1;
    lVar12 = 0;
    do {
      local_220 = lVar12 + 1;
      lVar11 = (long)iVar3;
      if (local_220 < lVar11) {
        lVar11 = *(long *)(result + 0x60);
        lVar15 = lVar14;
        do {
          lVar2 = *(long *)(result + 0x60);
          i = *(int *)(lVar2 + lVar15 * 8);
          if ((i < *(int *)(lVar11 + 4 + lVar12 * 8)) &&
             (*(int *)(lVar11 + lVar12 * 8) < *(int *)(lVar2 + 4 + lVar15 * 8))) {
            psVar5 = *(string **)(result + 8);
            if ((proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ <= lVar15) {
              internal::LogMessage::LogMessage
                        (&local_218,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar8 = internal::LogMessage::operator<<
                                 (&local_218,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar8);
              internal::LogMessage::~LogMessage(&local_218);
              i = *(int32 *)(lVar2 + lVar15 * 8);
            }
            pMVar1 = (Message *)
                     (proto->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar15];
            local_218._0_8_ = FastInt32ToBuffer(i,(char *)((long)&local_218.filename_ + 4));
            sVar9 = strlen((char *)local_218._0_8_);
            local_218.filename_._0_4_ = (undefined4)sVar9;
            local_1e0.text_ =
                 FastInt32ToBuffer(*(int *)(lVar2 + 4 + lVar15 * 8) + -1,local_1e0.scratch_);
            sVar9 = strlen(local_1e0.text_);
            local_1e0.size_ = (int)sVar9;
            local_180.text_ = FastInt32ToBuffer(*(int32 *)(lVar11 + lVar12 * 8),local_180.scratch_);
            sVar9 = strlen(local_180.text_);
            local_180.size_ = (int)sVar9;
            local_1b0.text_ =
                 FastInt32ToBuffer(*(int *)(lVar11 + 4 + lVar12 * 8) + -1,local_1b0.scratch_);
            sVar9 = strlen(local_1b0.text_);
            local_1b0.size_ = (int)sVar9;
            local_60.text_ = (char *)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            local_f0.text_ = (char *)0x0;
            local_f0.size_ = -1;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_250,
                       (strings *)
                       "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                       (char *)&local_218,&local_1e0,&local_180,&local_1b0,&local_60,&local_90,
                       &local_c0,&local_f0,&local_120,&local_150,(SubstituteArg *)arg9);
            AddError(local_228,psVar5,pMVar1,NUMBER,&local_250);
            result = local_230;
            proto = arg9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
              proto = arg9;
            }
            iVar3 = *(int *)(result + 0x58);
            arg9 = proto;
          }
          lVar15 = lVar15 + 1;
        } while ((int)lVar15 < iVar3);
        lVar11 = (long)iVar3;
      }
      lVar14 = lVar14 + 1;
      lVar12 = local_220;
    } while (local_220 < lVar11);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  // Check that no fields have numbers in extension ranges.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
  }

  // Check that extension ranges don't overlap.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}